

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::SetNormalPredictionMode
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,NormalPredictionMode mode)

{
  if (mode < 2) {
    (this->
    super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ).normal_prediction_mode_ = mode;
  }
  return mode < 2;
}

Assistant:

bool SetNormalPredictionMode(NormalPredictionMode mode) override {
    if (mode == ONE_TRIANGLE) {
      this->normal_prediction_mode_ = mode;
      return true;
    } else if (mode == TRIANGLE_AREA) {
      this->normal_prediction_mode_ = mode;
      return true;
    }
    return false;
  }